

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O0

void __thiscall BarrierTest_BasicPhasing_Test::TestBody(BarrierTest_BasicPhasing_Test *this)

{
  barrier<yamc::detail::default_barrier_completion> *nthread;
  anon_class_16_2_ba4713f6_for_f f;
  undefined1 local_88 [8];
  barrier<yamc::detail::default_barrier_completion> barrier;
  atomic<int> step;
  BarrierTest_BasicPhasing_Test *this_local;
  
  barrier.mtx_.super___mutex_base._M_mutex._36_4_ = 0;
  yamc::barrier<yamc::detail::default_barrier_completion>::barrier();
  nthread = (barrier<yamc::detail::default_barrier_completion> *)
            ((long)&barrier.mtx_.super___mutex_base._M_mutex + 0x24);
  f.barrier = nthread;
  f.step = (atomic<int> *)local_88;
  yamc::test::task_runner<BarrierTest_BasicPhasing_Test::TestBody()::__0>
            ((test *)0x3,(size_t)nthread,f);
  yamc::barrier<yamc::detail::default_barrier_completion>::~barrier
            ((barrier<yamc::detail::default_barrier_completion> *)local_88);
  return;
}

Assistant:

TEST(BarrierTest, BasicPhasing)
{
  SETUP_STEPTEST;
  yamc::barrier<> barrier{3};
  yamc::test::task_runner(
    3,
    [&](std::size_t id) {
      switch (id) {
      case 0:
        EXPECT_STEP(1);
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP_RANGE(4, 6);
        break;
      case 1:
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP(2);
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP_RANGE(4, 6);
        break;
      case 2:
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP(3);
        EXPECT_NO_THROW(barrier.arrive_and_wait());
        EXPECT_STEP_RANGE(4, 6);
        break;
      }
    }
  );
}